

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solvers.cpp
# Opt level: O0

vector<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_> *
getPredefinedTransformations2Plane1Line<float>
          (vector<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
           *__return_storage_ptr__,Matrix<float,_4,_1,_0,_4,_1> *Pi1,
          Matrix<float,_4,_1,_0,_4,_1> *Pi2,Matrix<float,_4,_1,_0,_4,_1> *Nu1,
          Matrix<float,_4,_1,_0,_4,_1> *Nu2,bool verbose)

{
  Scalar *pSVar1;
  CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_> *pCVar2;
  CommaInitializer<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *pCVar3;
  ostream *poVar4;
  float fVar5;
  __type _Var6;
  __type _Var7;
  double dVar8;
  double dVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  double dVar13;
  float fVar14;
  double dVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  XprTypeNested local_2f8;
  Product<Eigen::Inverse<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>,_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_0>
  local_2f0;
  Type local_2e0;
  Type local_2a8;
  IdentityReturnType local_26f;
  float local_26c;
  float local_268;
  Scalar local_264;
  CommaInitializer<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> local_260;
  float local_23c;
  float local_238;
  float local_234;
  float local_230;
  float local_22c;
  float local_228;
  float local_224;
  float local_220;
  float local_21c;
  CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_> local_218;
  XprTypeNested local_1f8;
  Product<Eigen::Inverse<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>,_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_0>
  local_1f0;
  Type local_1e0;
  Type local_1a8;
  IdentityReturnType local_16f;
  float local_16c;
  float local_168;
  Scalar local_164;
  CommaInitializer<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> local_160;
  float local_13c;
  float local_138;
  float local_134;
  float local_130;
  float local_12c;
  float local_128;
  float local_124;
  float local_120;
  float local_11c;
  CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_> local_118;
  Scalar local_f4;
  Scalar local_f0;
  float nu24;
  float nu23;
  float nu22;
  float nu21;
  float nu14;
  float nu13;
  float nu12;
  float nu11;
  float pi24;
  float pi23;
  float pi22;
  float pi21;
  float pi14;
  float pi13;
  float pi12;
  float pi11;
  Matrix<float,_3,_1,_0,_3,_1> auxT;
  Matrix<float,_3,_3,_0,_3,_3> auxRot;
  undefined1 local_78 [8];
  Matrix<float,_4,_4,_0,_4,_4> auxTrans;
  bool verbose_local;
  Matrix<float,_4,_1,_0,_4,_1> *Nu2_local;
  Matrix<float,_4,_1,_0,_4,_1> *Nu1_local;
  Matrix<float,_4,_1,_0,_4,_1> *Pi2_local;
  Matrix<float,_4,_1,_0,_4,_1> *Pi1_local;
  vector<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
  *outTrans;
  
  auxTrans.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0xf].
  _2_1_ = 0;
  auxTrans.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0xf].
  _3_1_ = verbose;
  std::
  vector<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
  ::vector(__return_storage_ptr__);
  Eigen::Matrix<float,_4,_4,_0,_4,_4>::Matrix((Matrix<float,_4,_4,_0,_4,_4> *)local_78);
  Eigen::Matrix<float,_3,_3,_0,_3,_3>::Matrix
            ((Matrix<float,_3,_3,_0,_3,_3> *)
             (auxT.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
              array + 1));
  Eigen::Matrix<float,_3,_1,_0,_3,_1>::Matrix((Matrix<float,_3,_1,_0,_3,_1> *)&pi12);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1> *)Pi1,0);
  pi13 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1> *)Pi1,1);
  pi14 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1> *)Pi1,2);
  pi21 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1> *)Pi1,3);
  pi22 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1> *)Pi2,0);
  pi23 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1> *)Pi2,1);
  pi24 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1> *)Pi2,2);
  nu11 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1> *)Pi2,3);
  nu12 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1> *)Nu1,0);
  nu13 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1> *)Nu1,1);
  nu14 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1> *)Nu1,2);
  nu21 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1> *)Nu1,3);
  nu22 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1> *)Nu2,0);
  nu23 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1> *)Nu2,1);
  nu24 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1> *)Nu2,2);
  local_f0 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1> *)Nu2,3);
  local_f4 = *pSVar1;
  fVar10 = pi21 * pi21;
  fVar5 = pi14 * pi14;
  _Var6 = std::pow<float,double>
                    (((fVar5 * pi23 + fVar10 * pi23) - pi13 * pi14 * pi24) - pi13 * pi21 * nu11,2.0)
  ;
  _Var7 = std::pow<float,double>(pi14 * nu11 - pi21 * pi24,2.0);
  dVar8 = sqrt((double)(fVar5 + fVar10) * _Var6 +
               _Var7 * (double)(pi14 * pi14 + pi21 * pi21) *
               (double)(pi21 * pi21 + pi13 * pi13 + pi14 * pi14));
  local_11c = (float)((1.0 / dVar8) * (double)(pi14 * nu11 - pi21 * pi24) *
                     (double)(pi14 * pi14 + pi21 * pi21));
  Eigen::DenseBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator<<
            (&local_118,
             (DenseBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_> *)
             (auxT.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
              array + 1),&local_11c);
  fVar10 = pi21 * pi21;
  fVar5 = pi14 * pi14;
  _Var6 = std::pow<float,double>
                    (((fVar5 * pi23 + fVar10 * pi23) - pi13 * pi14 * pi24) - pi13 * pi21 * nu11,2.0)
  ;
  _Var7 = std::pow<float,double>(pi14 * nu11 - pi21 * pi24,2.0);
  dVar8 = sqrt((double)(fVar5 + fVar10) * _Var6 +
               _Var7 * (double)(pi14 * pi14 + pi21 * pi21) *
               (double)(pi21 * pi21 + pi13 * pi13 + pi14 * pi14));
  local_120 = (float)((-1.0 / dVar8) * (double)(pi13 * nu11 - pi21 * pi23) *
                     (double)(pi14 * pi14 + pi21 * pi21));
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                     (&local_118,&local_120);
  fVar10 = pi21 * pi21;
  fVar5 = pi14 * pi14;
  _Var6 = std::pow<float,double>
                    (((fVar5 * pi23 + fVar10 * pi23) - pi13 * pi14 * pi24) - pi13 * pi21 * nu11,2.0)
  ;
  _Var7 = std::pow<float,double>(pi14 * nu11 - pi21 * pi24,2.0);
  dVar8 = sqrt((double)(fVar5 + fVar10) * _Var6 +
               _Var7 * (double)(pi14 * pi14 + pi21 * pi21) *
               (double)(pi21 * pi21 + pi13 * pi13 + pi14 * pi14));
  local_124 = (float)((1.0 / dVar8) * (double)(pi13 * pi24 - pi14 * pi23) *
                     (double)(pi14 * pi14 + pi21 * pi21));
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                     (pCVar2,&local_124);
  fVar10 = pi21 * pi21;
  fVar5 = pi14 * pi14;
  _Var6 = std::pow<float,double>
                    (((fVar5 * pi23 + fVar10 * pi23) - pi13 * pi14 * pi24) - pi13 * pi21 * nu11,2.0)
  ;
  _Var7 = std::pow<float,double>(pi14 * nu11 - pi21 * pi24,2.0);
  dVar8 = sqrt((double)(fVar5 + fVar10) * _Var6 +
               _Var7 * (double)(pi14 * pi14 + pi21 * pi21) *
               (double)(pi21 * pi21 + pi13 * pi13 + pi14 * pi14));
  fVar5 = pi21 * pi21;
  fVar10 = pi14 * pi14;
  dVar9 = std::sqrt((double)(ulong)(uint)(fVar5 + pi13 * pi13 + fVar10));
  local_128 = (float)((((-1.0 / dVar8) * (double)(fVar10 + fVar5)) / (double)SUB84(dVar9,0)) *
                     (double)(((pi14 * pi14 * pi23 + pi21 * pi21 * pi23) - pi13 * pi14 * pi24) -
                             pi13 * pi21 * nu11));
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                     (pCVar2,&local_128);
  fVar10 = pi21 * pi21;
  fVar5 = pi14 * pi14;
  _Var6 = std::pow<float,double>
                    (((fVar5 * pi23 + fVar10 * pi23) - pi13 * pi14 * pi24) - pi13 * pi21 * nu11,2.0)
  ;
  _Var7 = std::pow<float,double>(pi14 * nu11 - pi21 * pi24,2.0);
  dVar8 = sqrt((double)(fVar5 + fVar10) * _Var6 +
               _Var7 * (double)(pi14 * pi14 + pi21 * pi21) *
               (double)(pi21 * pi21 + pi13 * pi13 + pi14 * pi14));
  fVar5 = pi21 * pi21;
  fVar10 = pi14 * pi14;
  dVar9 = std::sqrt((double)(ulong)(uint)(fVar5 + pi13 * pi13 + fVar10));
  local_12c = (float)((((-1.0 / dVar8) * (double)(fVar10 + fVar5)) / (double)SUB84(dVar9,0)) *
                     (double)(((pi13 * pi13 * pi24 + pi21 * pi21 * pi24) - pi13 * pi14 * pi23) -
                             pi14 * pi21 * nu11));
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                     (pCVar2,&local_12c);
  fVar10 = pi21 * pi21;
  fVar5 = pi14 * pi14;
  _Var6 = std::pow<float,double>
                    (((fVar5 * pi23 + fVar10 * pi23) - pi13 * pi14 * pi24) - pi13 * pi21 * nu11,2.0)
  ;
  _Var7 = std::pow<float,double>(pi14 * nu11 - pi21 * pi24,2.0);
  dVar8 = sqrt((double)(fVar5 + fVar10) * _Var6 +
               _Var7 * (double)(pi14 * pi14 + pi21 * pi21) *
               (double)(pi21 * pi21 + pi13 * pi13 + pi14 * pi14));
  fVar5 = pi21 * pi21;
  fVar10 = pi14 * pi14;
  dVar9 = std::sqrt((double)(ulong)(uint)(fVar5 + pi13 * pi13 + fVar10));
  local_130 = (float)((((-1.0 / dVar8) * (double)(fVar10 + fVar5)) / (double)SUB84(dVar9,0)) *
                     (double)(((pi13 * pi13 * nu11 + pi14 * pi14 * nu11) - pi13 * pi21 * pi23) -
                             pi14 * pi21 * pi24));
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                     (pCVar2,&local_130);
  fVar5 = pi13;
  dVar8 = std::sqrt((double)(ulong)(uint)(pi21 * pi21 + pi13 * pi13 + pi14 * pi14));
  local_134 = fVar5 / SUB84(dVar8,0);
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                     (pCVar2,&local_134);
  fVar5 = pi14;
  dVar8 = std::sqrt((double)(ulong)(uint)(pi21 * pi21 + pi13 * pi13 + pi14 * pi14));
  local_138 = fVar5 / SUB84(dVar8,0);
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                     (pCVar2,&local_138);
  fVar5 = pi21;
  dVar8 = std::sqrt((double)(ulong)(uint)(pi21 * pi21 + pi13 * pi13 + pi14 * pi14));
  local_13c = fVar5 / SUB84(dVar8,0);
  Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_(pCVar2,&local_13c);
  Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::~CommaInitializer(&local_118);
  local_164 = 0.0;
  Eigen::DenseBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>::operator<<
            (&local_160,(DenseBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)&pi12,&local_164);
  dVar8 = std::sqrt((double)(ulong)(uint)(pi21 * pi21 + pi13 * pi13 + pi14 * pi14));
  fVar19 = pi13 * pi13;
  fVar14 = pi14 * pi14;
  fVar5 = fVar14 * nu12;
  fVar11 = fVar19 * nu12;
  fVar10 = pi21 * pi21;
  fVar16 = fVar10 * nu12;
  fVar12 = pi13 * pi22 * pi23;
  fVar17 = pi14 * pi22 * pi24;
  fVar18 = pi21 * pi22 * nu11;
  dVar15 = (double)(pi13 * pi14 * pi23 * pi24);
  dVar13 = (double)(pi13 * pi21 * pi23 * nu11);
  dVar9 = (double)(pi14 * pi21 * pi24 * nu11);
  dVar9 = sqrt((((double)(fVar10 * pi24 * pi24 +
                         fVar14 * nu11 * nu11 +
                         fVar10 * pi23 * pi23 +
                         fVar19 * nu11 * nu11 + fVar19 * pi24 * pi24 + fVar14 * pi23 * pi23) -
                (dVar15 + dVar15)) - (dVar13 + dVar13)) - (dVar9 + dVar9));
  local_168 = (float)(((-1.0 / (double)SUB84(dVar8,0)) *
                      (double)((((fVar16 + fVar11 + fVar5) - fVar12) - fVar17) - fVar18)) / dVar9);
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>::operator_
                     (&local_160,&local_168);
  fVar5 = pi22;
  dVar8 = std::sqrt((double)(ulong)(uint)(pi21 * pi21 + pi13 * pi13 + pi14 * pi14));
  local_16c = fVar5 / SUB84(dVar8,0);
  Eigen::CommaInitializer<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>::operator_(pCVar3,&local_16c);
  Eigen::CommaInitializer<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>::~CommaInitializer(&local_160);
  Eigen::MatrixBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::Identity(&local_16f,4,4);
  Eigen::Matrix<float,4,4,0,4,4>::operator=
            ((Matrix<float,4,4,0,4,4> *)local_78,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<float>,_Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
              *)&local_16f);
  Eigen::DenseBase<Eigen::Matrix<float,4,4,0,4,4>>::topLeftCorner<int,int>
            (&local_1a8,(DenseBase<Eigen::Matrix<float,4,4,0,4,4>> *)local_78,3,3);
  Eigen::Block<Eigen::Matrix<float,4,4,0,4,4>,-1,-1,false>::operator=
            ((Block<Eigen::Matrix<float,4,4,0,4,4>,_1,_1,false> *)&local_1a8,
             (DenseBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_> *)
             (auxT.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
              array + 1));
  Eigen::DenseBase<Eigen::Matrix<float,4,4,0,4,4>>::topRightCorner<int,int>
            (&local_1e0,(DenseBase<Eigen::Matrix<float,4,4,0,4,4>> *)local_78,3,1);
  Eigen::Block<Eigen::Matrix<float,4,4,0,4,4>,-1,-1,false>::operator=
            ((Block<Eigen::Matrix<float,4,4,0,4,4>,_1,_1,false> *)&local_1e0,
             (DenseBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)&pi12);
  if ((auxTrans.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
       [0xf]._3_1_ & 1) != 0) {
    poVar4 = std::operator<<((ostream *)&std::cout,"[VERBOSE] Matrix [U,u;0,0,0,1]");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    poVar4 = Eigen::operator<<(poVar4,(DenseBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_> *)local_78);
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  }
  if ((auxTrans.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
       [0xf]._3_1_ & 1) != 0) {
    poVar4 = std::operator<<((ostream *)&std::cout,"[VERBOSE] inv(T)*T = eye(3)");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    local_1f8 = (XprTypeNested)
                Eigen::MatrixBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::inverse
                          ((MatrixBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_> *)local_78);
    local_1f0 = Eigen::MatrixBase<Eigen::Inverse<Eigen::Matrix<float,4,4,0,4,4>>>::operator*
                          ((MatrixBase<Eigen::Inverse<Eigen::Matrix<float,4,4,0,4,4>>> *)&local_1f8,
                           (MatrixBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_> *)local_78);
    poVar4 = Eigen::operator<<(poVar4,(DenseBase<Eigen::Product<Eigen::Inverse<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>,_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_0>_>
                                       *)&local_1f0);
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  }
  std::
  vector<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
  ::push_back(__return_storage_ptr__,(value_type *)local_78);
  fVar10 = nu21 * nu21;
  fVar5 = nu14 * nu14;
  _Var6 = std::pow<float,double>
                    (((fVar5 * nu23 + fVar10 * nu23) - nu13 * nu14 * nu24) - nu13 * nu21 * local_f0,
                     2.0);
  _Var7 = std::pow<float,double>(nu14 * local_f0 - nu21 * nu24,2.0);
  dVar8 = sqrt((double)(fVar5 + fVar10) * _Var6 +
               _Var7 * (double)(nu14 * nu14 + nu21 * nu21) *
               (double)(nu21 * nu21 + nu13 * nu13 + nu14 * nu14));
  local_21c = (float)((1.0 / dVar8) * (double)(nu14 * local_f0 - nu21 * nu24) *
                     (double)(nu14 * nu14 + nu21 * nu21));
  Eigen::DenseBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator<<
            (&local_218,
             (DenseBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_> *)
             (auxT.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
              array + 1),&local_21c);
  fVar10 = nu21 * nu21;
  fVar5 = nu14 * nu14;
  _Var6 = std::pow<float,double>
                    (((fVar5 * nu23 + fVar10 * nu23) - nu13 * nu14 * nu24) - nu13 * nu21 * local_f0,
                     2.0);
  _Var7 = std::pow<float,double>(nu14 * local_f0 - nu21 * nu24,2.0);
  dVar8 = sqrt((double)(fVar5 + fVar10) * _Var6 +
               _Var7 * (double)(nu14 * nu14 + nu21 * nu21) *
               (double)(nu21 * nu21 + nu13 * nu13 + nu14 * nu14));
  local_220 = (float)((-1.0 / dVar8) * (double)(nu13 * local_f0 - nu21 * nu23) *
                     (double)(nu14 * nu14 + nu21 * nu21));
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                     (&local_218,&local_220);
  fVar10 = nu21 * nu21;
  fVar5 = nu14 * nu14;
  _Var6 = std::pow<float,double>
                    (((fVar5 * nu23 + fVar10 * nu23) - nu13 * nu14 * nu24) - nu13 * nu21 * local_f0,
                     2.0);
  _Var7 = std::pow<float,double>(nu14 * local_f0 - nu21 * nu24,2.0);
  dVar8 = sqrt((double)(fVar5 + fVar10) * _Var6 +
               _Var7 * (double)(nu14 * nu14 + nu21 * nu21) *
               (double)(nu21 * nu21 + nu13 * nu13 + nu14 * nu14));
  local_224 = (float)((1.0 / dVar8) * (double)(nu13 * nu24 - nu14 * nu23) *
                     (double)(nu14 * nu14 + nu21 * nu21));
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                     (pCVar2,&local_224);
  fVar10 = nu21 * nu21;
  fVar5 = nu14 * nu14;
  _Var6 = std::pow<float,double>
                    (((fVar5 * nu23 + fVar10 * nu23) - nu13 * nu14 * nu24) - nu13 * nu21 * local_f0,
                     2.0);
  _Var7 = std::pow<float,double>(nu14 * local_f0 - nu21 * nu24,2.0);
  dVar8 = sqrt((double)(fVar5 + fVar10) * _Var6 +
               _Var7 * (double)(nu14 * nu14 + nu21 * nu21) *
               (double)(nu21 * nu21 + nu13 * nu13 + nu14 * nu14));
  fVar5 = nu21 * nu21;
  fVar10 = nu14 * nu14;
  dVar9 = std::sqrt((double)(ulong)(uint)(fVar5 + nu13 * nu13 + fVar10));
  local_228 = (float)((((-1.0 / dVar8) * (double)(fVar10 + fVar5)) / (double)SUB84(dVar9,0)) *
                     (double)(((nu14 * nu14 * nu23 + nu21 * nu21 * nu23) - nu13 * nu14 * nu24) -
                             nu13 * nu21 * local_f0));
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                     (pCVar2,&local_228);
  fVar10 = nu21 * nu21;
  fVar5 = nu14 * nu14;
  _Var6 = std::pow<float,double>
                    (((fVar5 * nu23 + fVar10 * nu23) - nu13 * nu14 * nu24) - nu13 * nu21 * local_f0,
                     2.0);
  _Var7 = std::pow<float,double>(nu14 * local_f0 - nu21 * nu24,2.0);
  dVar8 = sqrt((double)(fVar5 + fVar10) * _Var6 +
               _Var7 * (double)(nu14 * nu14 + nu21 * nu21) *
               (double)(nu21 * nu21 + nu13 * nu13 + nu14 * nu14));
  fVar5 = nu21 * nu21;
  fVar10 = nu14 * nu14;
  dVar9 = std::sqrt((double)(ulong)(uint)(fVar5 + nu13 * nu13 + fVar10));
  local_22c = (float)((((-1.0 / dVar8) * (double)(fVar10 + fVar5)) / (double)SUB84(dVar9,0)) *
                     (double)(((nu13 * nu13 * nu24 + nu21 * nu21 * nu24) - nu13 * nu14 * nu23) -
                             nu14 * nu21 * local_f0));
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                     (pCVar2,&local_22c);
  fVar10 = nu21 * nu21;
  fVar5 = nu14 * nu14;
  _Var6 = std::pow<float,double>
                    (((fVar5 * nu23 + fVar10 * nu23) - nu13 * nu14 * nu24) - nu13 * nu21 * local_f0,
                     2.0);
  _Var7 = std::pow<float,double>(nu14 * local_f0 - nu21 * nu24,2.0);
  dVar8 = sqrt((double)(fVar5 + fVar10) * _Var6 +
               _Var7 * (double)(nu14 * nu14 + nu21 * nu21) *
               (double)(nu21 * nu21 + nu13 * nu13 + nu14 * nu14));
  fVar5 = nu21 * nu21;
  fVar10 = nu14 * nu14;
  dVar9 = std::sqrt((double)(ulong)(uint)(fVar5 + nu13 * nu13 + fVar10));
  local_230 = (float)((((-1.0 / dVar8) * (double)(fVar10 + fVar5)) / (double)SUB84(dVar9,0)) *
                     (double)(((nu13 * nu13 * local_f0 + nu14 * nu14 * local_f0) -
                              nu13 * nu21 * nu23) - nu14 * nu21 * nu24));
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                     (pCVar2,&local_230);
  fVar5 = nu13;
  dVar8 = std::sqrt((double)(ulong)(uint)(nu21 * nu21 + nu13 * nu13 + nu14 * nu14));
  local_234 = fVar5 / SUB84(dVar8,0);
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                     (pCVar2,&local_234);
  fVar5 = nu14;
  dVar8 = std::sqrt((double)(ulong)(uint)(nu21 * nu21 + nu13 * nu13 + nu14 * nu14));
  local_238 = fVar5 / SUB84(dVar8,0);
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                     (pCVar2,&local_238);
  fVar5 = nu21;
  dVar8 = std::sqrt((double)(ulong)(uint)(nu21 * nu21 + nu13 * nu13 + nu14 * nu14));
  local_23c = fVar5 / SUB84(dVar8,0);
  Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_(pCVar2,&local_23c);
  Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::~CommaInitializer(&local_218);
  local_264 = 0.0;
  Eigen::DenseBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>::operator<<
            (&local_260,(DenseBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)&pi12,&local_264);
  dVar8 = std::sqrt((double)(ulong)(uint)(nu21 * nu21 + nu13 * nu13 + nu14 * nu14));
  fVar19 = nu13 * nu13;
  fVar14 = nu14 * nu14;
  fVar5 = fVar14 * local_f4;
  fVar11 = fVar19 * local_f4;
  fVar10 = nu21 * nu21;
  fVar16 = fVar10 * local_f4;
  fVar12 = nu13 * nu22 * nu23;
  fVar17 = nu14 * nu22 * nu24;
  fVar18 = nu21 * nu22 * local_f0;
  dVar15 = (double)(nu13 * nu14 * nu23 * nu24);
  dVar13 = (double)(nu13 * nu21 * nu23 * local_f0);
  dVar9 = (double)(nu14 * nu21 * nu24 * local_f0);
  dVar9 = sqrt((((double)(fVar10 * nu24 * nu24 +
                         fVar14 * local_f0 * local_f0 +
                         fVar10 * nu23 * nu23 +
                         fVar19 * local_f0 * local_f0 + fVar19 * nu24 * nu24 + fVar14 * nu23 * nu23)
                - (dVar15 + dVar15)) - (dVar13 + dVar13)) - (dVar9 + dVar9));
  local_268 = (float)(((-1.0 / (double)SUB84(dVar8,0)) *
                      (double)((((fVar16 + fVar11 + fVar5) - fVar12) - fVar17) - fVar18)) / dVar9);
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>::operator_
                     (&local_260,&local_268);
  fVar5 = nu22;
  dVar8 = std::sqrt((double)(ulong)(uint)(nu21 * nu21 + nu13 * nu13 + nu14 * nu14));
  local_26c = fVar5 / SUB84(dVar8,0);
  Eigen::CommaInitializer<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>::operator_(pCVar3,&local_26c);
  Eigen::CommaInitializer<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>::~CommaInitializer(&local_260);
  Eigen::MatrixBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::Identity(&local_26f,4,4);
  Eigen::Matrix<float,4,4,0,4,4>::operator=
            ((Matrix<float,4,4,0,4,4> *)local_78,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<float>,_Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
              *)&local_26f);
  Eigen::DenseBase<Eigen::Matrix<float,4,4,0,4,4>>::topLeftCorner<int,int>
            (&local_2a8,(DenseBase<Eigen::Matrix<float,4,4,0,4,4>> *)local_78,3,3);
  Eigen::Block<Eigen::Matrix<float,4,4,0,4,4>,-1,-1,false>::operator=
            ((Block<Eigen::Matrix<float,4,4,0,4,4>,_1,_1,false> *)&local_2a8,
             (DenseBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_> *)
             (auxT.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
              array + 1));
  Eigen::DenseBase<Eigen::Matrix<float,4,4,0,4,4>>::topRightCorner<int,int>
            (&local_2e0,(DenseBase<Eigen::Matrix<float,4,4,0,4,4>> *)local_78,3,1);
  Eigen::Block<Eigen::Matrix<float,4,4,0,4,4>,-1,-1,false>::operator=
            ((Block<Eigen::Matrix<float,4,4,0,4,4>,_1,_1,false> *)&local_2e0,
             (DenseBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)&pi12);
  if ((auxTrans.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
       [0xf]._3_1_ & 1) != 0) {
    poVar4 = std::operator<<((ostream *)&std::cout,"[VERBOSE] Matrix [V,v;0,0,0,1]");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    poVar4 = Eigen::operator<<(poVar4,(DenseBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_> *)local_78);
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  }
  if ((auxTrans.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
       [0xf]._3_1_ & 1) != 0) {
    poVar4 = std::operator<<((ostream *)&std::cout,"[VERBOSE] inv(T)*T = eye(3)");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    local_2f8 = (XprTypeNested)
                Eigen::MatrixBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::inverse
                          ((MatrixBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_> *)local_78);
    local_2f0 = Eigen::MatrixBase<Eigen::Inverse<Eigen::Matrix<float,4,4,0,4,4>>>::operator*
                          ((MatrixBase<Eigen::Inverse<Eigen::Matrix<float,4,4,0,4,4>>> *)&local_2f8,
                           (MatrixBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_> *)local_78);
    poVar4 = Eigen::operator<<(poVar4,(DenseBase<Eigen::Product<Eigen::Inverse<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>,_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_0>_>
                                       *)&local_2f0);
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  }
  std::
  vector<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
  ::push_back(__return_storage_ptr__,(value_type *)local_78);
  return __return_storage_ptr__;
}

Assistant:

vector<Matrix<floatPrec, 4, 4>> getPredefinedTransformations2Plane1Line(
	Matrix<floatPrec, 4, 1> Pi1, Matrix<floatPrec, 4, 1> Pi2,
	Matrix<floatPrec, 4, 1> Nu1, Matrix<floatPrec, 4, 1> Nu2,
	bool verbose)
{

	vector<Matrix<floatPrec, 4, 4>> outTrans;
	Matrix<floatPrec, 4, 4> auxTrans;
	Matrix<floatPrec, 3, 3> auxRot;
	Matrix<floatPrec, 3, 1> auxT;

	floatPrec pi11, pi12, pi13, pi14;
	floatPrec pi21, pi22, pi23, pi24;
	floatPrec nu11, nu12, nu13, nu14;
	floatPrec nu21, nu22, nu23, nu24;

	pi11 = Pi1(0);
	pi12 = Pi1(1);
	pi13 = Pi1(2);
	pi14 = Pi1(3);
	pi21 = Pi2(0);
	pi22 = Pi2(1);
	pi23 = Pi2(2);
	pi24 = Pi2(3);
	nu11 = Nu1(0);
	nu12 = Nu1(1);
	nu13 = Nu1(2);
	nu14 = Nu1(3);
	nu21 = Nu2(0);
	nu22 = Nu2(1);
	nu23 = Nu2(2);
	nu24 = Nu2(3);

	// Compute U Matrix
	auxRot << 1.0 / sqrt((pi12 * pi12 + pi13 * pi13) * pow((pi12 * pi12) * pi21 + (pi13 * pi13) * pi21 - pi11 * pi12 * pi22 - pi11 * pi13 * pi23, 2.0) + pow(pi12 * pi23 - pi13 * pi22, 2.0) * (pi12 * pi12 + pi13 * pi13) * (pi11 * pi11 + pi12 * pi12 + pi13 * pi13)) * (pi12 * pi23 - pi13 * pi22) * (pi12 * pi12 + pi13 * pi13),
		-1.0 / sqrt((pi12 * pi12 + pi13 * pi13) * pow((pi12 * pi12) * pi21 + (pi13 * pi13) * pi21 - pi11 * pi12 * pi22 - pi11 * pi13 * pi23, 2.0) + pow(pi12 * pi23 - pi13 * pi22, 2.0) * (pi12 * pi12 + pi13 * pi13) * (pi11 * pi11 + pi12 * pi12 + pi13 * pi13)) * (pi11 * pi23 - pi13 * pi21) * (pi12 * pi12 + pi13 * pi13),
		1.0 / sqrt((pi12 * pi12 + pi13 * pi13) * pow((pi12 * pi12) * pi21 + (pi13 * pi13) * pi21 - pi11 * pi12 * pi22 - pi11 * pi13 * pi23, 2.0) + pow(pi12 * pi23 - pi13 * pi22, 2.0) * (pi12 * pi12 + pi13 * pi13) * (pi11 * pi11 + pi12 * pi12 + pi13 * pi13)) * (pi11 * pi22 - pi12 * pi21) * (pi12 * pi12 + pi13 * pi13),
		-1.0 / sqrt((pi12 * pi12 + pi13 * pi13) * pow((pi12 * pi12) * pi21 + (pi13 * pi13) * pi21 - pi11 * pi12 * pi22 - pi11 * pi13 * pi23, 2.0) + pow(pi12 * pi23 - pi13 * pi22, 2.0) * (pi12 * pi12 + pi13 * pi13) * (pi11 * pi11 + pi12 * pi12 + pi13 * pi13)) * (pi12 * pi12 + pi13 * pi13) * 1.0 / sqrt(pi11 * pi11 + pi12 * pi12 + pi13 * pi13) * ((pi12 * pi12) * pi21 + (pi13 * pi13) * pi21 - pi11 * pi12 * pi22 - pi11 * pi13 * pi23),
		-1.0 / sqrt((pi12 * pi12 + pi13 * pi13) * pow((pi12 * pi12) * pi21 + (pi13 * pi13) * pi21 - pi11 * pi12 * pi22 - pi11 * pi13 * pi23, 2.0) + pow(pi12 * pi23 - pi13 * pi22, 2.0) * (pi12 * pi12 + pi13 * pi13) * (pi11 * pi11 + pi12 * pi12 + pi13 * pi13)) * (pi12 * pi12 + pi13 * pi13) * 1.0 / sqrt(pi11 * pi11 + pi12 * pi12 + pi13 * pi13) * ((pi11 * pi11) * pi22 + (pi13 * pi13) * pi22 - pi11 * pi12 * pi21 - pi12 * pi13 * pi23),
		-1.0 / sqrt((pi12 * pi12 + pi13 * pi13) * pow((pi12 * pi12) * pi21 + (pi13 * pi13) * pi21 - pi11 * pi12 * pi22 - pi11 * pi13 * pi23, 2.0) + pow(pi12 * pi23 - pi13 * pi22, 2.0) * (pi12 * pi12 + pi13 * pi13) * (pi11 * pi11 + pi12 * pi12 + pi13 * pi13)) * (pi12 * pi12 + pi13 * pi13) * 1.0 / sqrt(pi11 * pi11 + pi12 * pi12 + pi13 * pi13) * ((pi11 * pi11) * pi23 + (pi12 * pi12) * pi23 - pi11 * pi13 * pi21 - pi12 * pi13 * pi22),
		pi11 * 1.0 / sqrt(pi11 * pi11 + pi12 * pi12 + pi13 * pi13),
		pi12 * 1.0 / sqrt(pi11 * pi11 + pi12 * pi12 + pi13 * pi13),
		pi13 * 1.0 / sqrt(pi11 * pi11 + pi12 * pi12 + pi13 * pi13);

	// Compute u vector
	auxT << 0.0,
		-1.0 / sqrt(pi11 * pi11 + pi12 * pi12 + pi13 * pi13) * ((pi11 * pi11) * pi24 + (pi12 * pi12) * pi24 + (pi13 * pi13) * pi24 - pi11 * pi14 * pi21 - pi12 * pi14 * pi22 - pi13 * pi14 * pi23) * 1.0 / sqrt((pi11 * pi11) * (pi22 * pi22) + (pi12 * pi12) * (pi21 * pi21) + (pi11 * pi11) * (pi23 * pi23) + (pi13 * pi13) * (pi21 * pi21) + (pi12 * pi12) * (pi23 * pi23) + (pi13 * pi13) * (pi22 * pi22) - pi11 * pi12 * pi21 * pi22 * 2.0 - pi11 * pi13 * pi21 * pi23 * 2.0 - pi12 * pi13 * pi22 * pi23 * 2.0),
		pi14 * 1.0 / sqrt(pi11 * pi11 + pi12 * pi12 + pi13 * pi13);

	auxTrans = Matrix<floatPrec, 4, 4>::Identity(4, 4);
	auxTrans.topLeftCorner(3, 3) = auxRot;
	auxTrans.topRightCorner(3, 1) = auxT;

	if (verbose)
		cout << "[VERBOSE] Matrix [U,u;0,0,0,1]" << endl
			 << auxTrans << endl;
	if (verbose)
		cout << "[VERBOSE] inv(T)*T = eye(3)" << endl
			 << auxTrans.inverse() * auxTrans << endl;

	// add U,u to the output vector
	outTrans.push_back(auxTrans);

	// Compute V Matrix
	auxRot << 1.0 / sqrt((nu12 * nu12 + nu13 * nu13) * pow((nu12 * nu12) * nu21 + (nu13 * nu13) * nu21 - nu11 * nu12 * nu22 - nu11 * nu13 * nu23, 2.0) + pow(nu12 * nu23 - nu13 * nu22, 2.0) * (nu12 * nu12 + nu13 * nu13) * (nu11 * nu11 + nu12 * nu12 + nu13 * nu13)) * (nu12 * nu23 - nu13 * nu22) * (nu12 * nu12 + nu13 * nu13),
		-1.0 / sqrt((nu12 * nu12 + nu13 * nu13) * pow((nu12 * nu12) * nu21 + (nu13 * nu13) * nu21 - nu11 * nu12 * nu22 - nu11 * nu13 * nu23, 2.0) + pow(nu12 * nu23 - nu13 * nu22, 2.0) * (nu12 * nu12 + nu13 * nu13) * (nu11 * nu11 + nu12 * nu12 + nu13 * nu13)) * (nu11 * nu23 - nu13 * nu21) * (nu12 * nu12 + nu13 * nu13),
		1.0 / sqrt((nu12 * nu12 + nu13 * nu13) * pow((nu12 * nu12) * nu21 + (nu13 * nu13) * nu21 - nu11 * nu12 * nu22 - nu11 * nu13 * nu23, 2.0) + pow(nu12 * nu23 - nu13 * nu22, 2.0) * (nu12 * nu12 + nu13 * nu13) * (nu11 * nu11 + nu12 * nu12 + nu13 * nu13)) * (nu11 * nu22 - nu12 * nu21) * (nu12 * nu12 + nu13 * nu13),
		-1.0 / sqrt((nu12 * nu12 + nu13 * nu13) * pow((nu12 * nu12) * nu21 + (nu13 * nu13) * nu21 - nu11 * nu12 * nu22 - nu11 * nu13 * nu23, 2.0) + pow(nu12 * nu23 - nu13 * nu22, 2.0) * (nu12 * nu12 + nu13 * nu13) * (nu11 * nu11 + nu12 * nu12 + nu13 * nu13)) * (nu12 * nu12 + nu13 * nu13) * 1.0 / sqrt(nu11 * nu11 + nu12 * nu12 + nu13 * nu13) * ((nu12 * nu12) * nu21 + (nu13 * nu13) * nu21 - nu11 * nu12 * nu22 - nu11 * nu13 * nu23),
		-1.0 / sqrt((nu12 * nu12 + nu13 * nu13) * pow((nu12 * nu12) * nu21 + (nu13 * nu13) * nu21 - nu11 * nu12 * nu22 - nu11 * nu13 * nu23, 2.0) + pow(nu12 * nu23 - nu13 * nu22, 2.0) * (nu12 * nu12 + nu13 * nu13) * (nu11 * nu11 + nu12 * nu12 + nu13 * nu13)) * (nu12 * nu12 + nu13 * nu13) * 1.0 / sqrt(nu11 * nu11 + nu12 * nu12 + nu13 * nu13) * ((nu11 * nu11) * nu22 + (nu13 * nu13) * nu22 - nu11 * nu12 * nu21 - nu12 * nu13 * nu23),
		-1.0 / sqrt((nu12 * nu12 + nu13 * nu13) * pow((nu12 * nu12) * nu21 + (nu13 * nu13) * nu21 - nu11 * nu12 * nu22 - nu11 * nu13 * nu23, 2.0) + pow(nu12 * nu23 - nu13 * nu22, 2.0) * (nu12 * nu12 + nu13 * nu13) * (nu11 * nu11 + nu12 * nu12 + nu13 * nu13)) * (nu12 * nu12 + nu13 * nu13) * 1.0 / sqrt(nu11 * nu11 + nu12 * nu12 + nu13 * nu13) * ((nu11 * nu11) * nu23 + (nu12 * nu12) * nu23 - nu11 * nu13 * nu21 - nu12 * nu13 * nu22),
		nu11 * 1.0 / sqrt(nu11 * nu11 + nu12 * nu12 + nu13 * nu13),
		nu12 * 1.0 / sqrt(nu11 * nu11 + nu12 * nu12 + nu13 * nu13),
		nu13 * 1.0 / sqrt(nu11 * nu11 + nu12 * nu12 + nu13 * nu13);

	// Compute v vector
	auxT << 0.0,
		-1.0 / sqrt(nu11 * nu11 + nu12 * nu12 + nu13 * nu13) * ((nu11 * nu11) * nu24 + (nu12 * nu12) * nu24 + (nu13 * nu13) * nu24 - nu11 * nu14 * nu21 - nu12 * nu14 * nu22 - nu13 * nu14 * nu23) * 1.0 / sqrt((nu11 * nu11) * (nu22 * nu22) + (nu12 * nu12) * (nu21 * nu21) + (nu11 * nu11) * (nu23 * nu23) + (nu13 * nu13) * (nu21 * nu21) + (nu12 * nu12) * (nu23 * nu23) + (nu13 * nu13) * (nu22 * nu22) - nu11 * nu12 * nu21 * nu22 * 2.0 - nu11 * nu13 * nu21 * nu23 * 2.0 - nu12 * nu13 * nu22 * nu23 * 2.0),
		nu14 * 1.0 / sqrt(nu11 * nu11 + nu12 * nu12 + nu13 * nu13);

	auxTrans = Matrix<floatPrec, 4, 4>::Identity(4, 4);
	auxTrans.topLeftCorner(3, 3) = auxRot;
	auxTrans.topRightCorner(3, 1) = auxT;

	if (verbose)
		cout << "[VERBOSE] Matrix [V,v;0,0,0,1]" << endl
			 << auxTrans << endl;
	if (verbose)
		cout << "[VERBOSE] inv(T)*T = eye(3)" << endl
			 << auxTrans.inverse() * auxTrans << endl;

	// add V,v to the output vector
	outTrans.push_back(auxTrans);

	return outTrans;
}